

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cpp
# Opt level: O2

int __thiscall llvm::sys::unicode::columnWidthUTF8(unicode *this,StringRef Text)

{
  UTF32 C [1];
  UTF8 first;
  bool bVar1;
  uint uVar2;
  ConversionResult CVar3;
  int iVar4;
  char *Index;
  int iVar5;
  size_t e;
  CharRanges Ranges;
  CharRanges Ranges_00;
  UTF32 buf [1];
  UTF32 *Target;
  UTF8 *Start;
  StringRef Text_local;
  
  iVar5 = 0;
  Index = (char *)0x0;
  Text_local.Data = (char *)this;
  Text_local.Length = (size_t)Text.Data;
  while( true ) {
    if (Text.Data <= Index) {
      return iVar5;
    }
    first = StringRef::operator[](&Text_local,(size_t)Index);
    uVar2 = getNumBytesForUTF8(first);
    if (uVar2 == 0) {
      return -2;
    }
    if (Text_local.Length < Index + uVar2) {
      return -2;
    }
    Start = (UTF8 *)(Index + (long)Text_local.Data);
    Target = buf;
    CVar3 = ConvertUTF8toUTF32(&Start,Start + uVar2,&Target,(UTF32 *)&Target,strictConversion);
    C[0] = buf[0];
    if (CVar3 != conversionOK) break;
    bVar1 = isPrintable(buf[0]);
    if (!bVar1) {
      return -1;
    }
    if ((charWidth(int)::CombiningCharacters == '\0') &&
       (iVar4 = __cxa_guard_acquire(&charWidth(int)::CombiningCharacters), iVar4 != 0)) {
      Ranges.Length = 0xda;
      Ranges.Data = (UnicodeCharRange *)charWidth(int)::CombiningCharacterRanges;
      UnicodeCharSet::UnicodeCharSet((UnicodeCharSet *)charWidth(int)::CombiningCharacters,Ranges);
      __cxa_guard_release(&charWidth(int)::CombiningCharacters);
    }
    bVar1 = UnicodeCharSet::contains((UnicodeCharSet *)charWidth(int)::CombiningCharacters,C[0]);
    iVar4 = 0;
    if (!bVar1) {
      if ((charWidth(int)::DoubleWidthCharacters == '\0') &&
         (iVar4 = __cxa_guard_acquire(&charWidth(int)::DoubleWidthCharacters), iVar4 != 0)) {
        Ranges_00.Length = 0xf;
        Ranges_00.Data = (UnicodeCharRange *)charWidth(int)::DoubleWidthCharacterRanges;
        UnicodeCharSet::UnicodeCharSet
                  ((UnicodeCharSet *)charWidth(int)::DoubleWidthCharacters,Ranges_00);
        __cxa_guard_release(&charWidth(int)::DoubleWidthCharacters);
      }
      bVar1 = UnicodeCharSet::contains((UnicodeCharSet *)charWidth(int)::DoubleWidthCharacters,C[0])
      ;
      iVar4 = bVar1 + 1;
    }
    iVar5 = iVar5 + iVar4;
    Index = Index + uVar2;
  }
  return -2;
}

Assistant:

int columnWidthUTF8(StringRef Text) {
  unsigned ColumnWidth = 0;
  unsigned Length;
  for (size_t i = 0, e = Text.size(); i < e; i += Length) {
    Length = getNumBytesForUTF8(Text[i]);
    if (Length <= 0 || i + Length > Text.size())
      return ErrorInvalidUTF8;
    UTF32 buf[1];
    const UTF8 *Start = reinterpret_cast<const UTF8 *>(Text.data() + i);
    UTF32 *Target = &buf[0];
    if (conversionOK != ConvertUTF8toUTF32(&Start, Start + Length, &Target,
                                           Target + 1, strictConversion))
      return ErrorInvalidUTF8;
    int Width = charWidth(buf[0]);
    if (Width < 0)
      return ErrorNonPrintableCharacter;
    ColumnWidth += Width;
  }
  return ColumnWidth;
}